

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newHttpClient(kj *this,HttpHeaderTable *responseHeaderTable,AsyncIoStream *stream,
                 HttpClientSettings *settings)

{
  AsyncIoStream *pAVar1;
  HttpClientImpl *this_00;
  HttpClient *extraout_RDX;
  HttpClient *extraout_RDX_00;
  HttpClient *pHVar2;
  Own<kj::HttpClient,_std::nullptr_t> OVar3;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_70;
  HttpClientSettings local_60;
  
  this_00 = (HttpClientImpl *)operator_new(0x178);
  local_70.disposer = (Disposer *)&NullDisposer::instance;
  local_60.idleTimeout.value = (settings->idleTimeout).value;
  local_60.entropySource.ptr = (settings->entropySource).ptr;
  (settings->entropySource).ptr = (EntropySource *)0x0;
  local_60.errorHandler.ptr = (settings->errorHandler).ptr;
  (settings->errorHandler).ptr = (HttpClientErrorHandler *)0x0;
  local_60.webSocketCompressionMode = settings->webSocketCompressionMode;
  local_60.webSocketErrorHandler.ptr = (settings->webSocketErrorHandler).ptr;
  (settings->webSocketErrorHandler).ptr = (WebSocketErrorHandler *)0x0;
  local_60.tlsContext.ptr = (settings->tlsContext).ptr;
  (settings->tlsContext).ptr = (SecureNetworkWrapper *)0x0;
  local_70.ptr = stream;
  anon_unknown_36::HttpClientImpl::HttpClientImpl(this_00,responseHeaderTable,&local_70,&local_60);
  pAVar1 = local_70.ptr;
  pHVar2 = extraout_RDX;
  if (local_70.ptr != (AsyncIoStream *)0x0) {
    local_70.ptr = (AsyncIoStream *)0x0;
    (**(local_70.disposer)->_vptr_Disposer)
              (local_70.disposer,
               (pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream);
    pHVar2 = extraout_RDX_00;
  }
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl>::instance;
  *(HttpClientImpl **)(this + 8) = this_00;
  OVar3.ptr = pHVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

kj::Own<HttpClient> newHttpClient(
    const HttpHeaderTable& responseHeaderTable, kj::AsyncIoStream& stream,
    HttpClientSettings settings) {
  return kj::heap<HttpClientImpl>(responseHeaderTable,
      kj::Own<kj::AsyncIoStream>(&stream, kj::NullDisposer::instance),
      kj::mv(settings));
}